

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O1

void __thiscall
PartitionTable::partition_enumerator
          (PartitionTable *this,function<void_(unsigned_char,_unsigned_long,_unsigned_long)> *fn)

{
  uchar __args;
  long lVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    __args = (&this->_table[0]._type)[lVar2];
    if ((__args != '\0') ||
       ((ulong)*(uint *)((long)&this->_table[0]._nrsectors + lVar2) *
        *(long *)((long)&this->_table[0]._sectorsize + lVar2) != 0)) {
      lVar1 = *(long *)((long)&this->_table[0]._sectorsize + lVar2);
      std::function<void_(unsigned_char,_unsigned_long,_unsigned_long)>::operator()
                (fn,__args,(ulong)*(uint *)((long)&this->_table[0]._startsector + lVar2) * lVar1,
                 (ulong)*(uint *)((long)&this->_table[0]._nrsectors + lVar2) * lVar1);
    }
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x80);
  return;
}

Assistant:

void partition_enumerator(std::function<void(uint8_t,uint64_t,uint64_t)> fn)
    {
        for (int i=0 ; i<4 ; i++)
            if (_table[i].type() || _table[i].size())
                fn(_table[i].type(), _table[i].start(), _table[i].size());
    }